

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O2

int __thiscall glslang::TScanContext::identifierOrType(TScanContext *this)

{
  char cVar1;
  int iVar2;
  TString *pTVar3;
  TSymbol *pTVar4;
  undefined4 extraout_var;
  long *plVar5;
  int iVar6;
  
  pTVar3 = NewPoolTString_abi_cxx11_(this->tokenText);
  (this->parserToken->sType->lex).field_1.string = pTVar3;
  iVar6 = 0x289;
  if (this->field == false) {
    pTVar4 = TSymbolTable::find(this->parseContext->symbolTable,
                                (this->parserToken->sType->lex).field_1.string,(bool *)0x0,
                                (bool *)0x0,(int *)0x0);
    (this->parserToken->sType->lex).symbol = pTVar4;
    if ((this->afterStruct == false && this->afterType == false) &&
       (pTVar4 = (this->parserToken->sType->lex).symbol, pTVar4 != (TSymbol *)0x0)) {
      iVar2 = (*pTVar4->_vptr_TSymbol[9])();
      plVar5 = (long *)CONCAT44(extraout_var,iVar2);
      if (plVar5 != (long *)0x0) {
        cVar1 = (**(code **)(*plVar5 + 0xb0))(plVar5);
        if (cVar1 != '\0') {
          plVar5 = (long *)(**(code **)(*plVar5 + 0x60))(plVar5);
          iVar2 = (**(code **)(*plVar5 + 0x38))(plVar5);
          if ((iVar2 != 0x12) || (this->afterBuffer == false)) {
            this->afterType = true;
            iVar6 = 0x28a;
          }
        }
      }
    }
  }
  return iVar6;
}

Assistant:

int TScanContext::identifierOrType()
{
    parserToken->sType.lex.string = NewPoolTString(tokenText);
    if (field)
        return IDENTIFIER;

    parserToken->sType.lex.symbol = parseContext.symbolTable.find(*parserToken->sType.lex.string);
    if ((afterType == false && afterStruct == false) && parserToken->sType.lex.symbol != nullptr) {
        if (const TVariable* variable = parserToken->sType.lex.symbol->getAsVariable()) {
            if (variable->isUserType() &&
                // treat redeclaration of forward-declared buffer/uniform reference as an identifier
                !(variable->getType().isReference() && afterBuffer)) {
                afterType = true;

                return TYPE_NAME;
            }
        }
    }

    return IDENTIFIER;
}